

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCreateCone(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,char *pNodeName,int fUseAllCis)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *p1;
  int local_440;
  int local_43c;
  int k;
  int i;
  char Buffer [1000];
  Abc_Obj_t *pNodeCoNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtkNew;
  int fUseAllCis_local;
  char *pNodeName_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtk_local;
  
  pNodeName_local = (char *)pNode;
  pNode_local = (Abc_Obj_t *)pNtk;
  iVar1 = Abc_NtkIsLogic(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsStrash((Abc_Ntk_t *)pNode_local), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x36e,"Abc_Ntk_t *Abc_NtkCreateCone(Abc_Ntk_t *, Abc_Obj_t *, char *, int)");
  }
  iVar1 = Abc_ObjIsNode((Abc_Obj_t *)pNodeName_local);
  if ((iVar1 == 0) &&
     ((iVar1 = Abc_NtkIsStrash((Abc_Ntk_t *)pNode_local), iVar1 == 0 ||
      ((iVar1 = Abc_AigNodeIsConst((Abc_Obj_t *)pNodeName_local), iVar1 == 0 &&
       (iVar1 = Abc_ObjIsCi((Abc_Obj_t *)pNodeName_local), iVar1 == 0)))))) {
    __assert_fail("Abc_ObjIsNode(pNode) || (Abc_NtkIsStrash(pNtk) && (Abc_AigNodeIsConst(pNode) || Abc_ObjIsCi(pNode)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x36f,"Abc_Ntk_t *Abc_NtkCreateCone(Abc_Ntk_t *, Abc_Obj_t *, char *, int)");
  }
  pNtk_00 = Abc_NtkAlloc(*(Abc_NtkType_t *)&pNode_local->pNtk,
                         *(Abc_NtkFunc_t *)((long)&pNode_local->pNtk + 4),1);
  sprintf((char *)&k,"%s_%s",pNode_local->pNext,pNodeName);
  pcVar2 = Extra_UtilStrsav((char *)&k);
  pNtk_00->pName = pcVar2;
  iVar1 = Abc_NtkIsStrash((Abc_Ntk_t *)pNode_local);
  if (iVar1 != 0) {
    pAVar3 = Abc_AigConst1(pNtk_00);
    pAVar4 = Abc_AigConst1((Abc_Ntk_t *)pNode_local);
    (pAVar4->field_6).pCopy = pAVar3;
  }
  p = Abc_NtkDfsNodes((Abc_Ntk_t *)pNode_local,(Abc_Obj_t **)&pNodeName_local,1);
  for (local_43c = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pNode_local), local_43c < iVar1;
      local_43c = local_43c + 1) {
    pAVar3 = Abc_NtkCi((Abc_Ntk_t *)pNode_local,local_43c);
    if ((fUseAllCis != 0) || (iVar1 = Abc_NodeIsTravIdCurrent(pAVar3), iVar1 != 0)) {
      pAVar4 = Abc_NtkCreatePi(pNtk_00);
      (pAVar3->field_6).pCopy = pAVar4;
      pAVar4 = (pAVar3->field_6).pCopy;
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
    }
  }
  Buffer._992_8_ = Abc_NtkCreatePo(pNtk_00);
  Abc_ObjAssignName((Abc_Obj_t *)Buffer._992_8_,pNodeName,(char *)0x0);
  for (local_43c = 0; iVar1 = Vec_PtrSize(p), local_43c < iVar1; local_43c = local_43c + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,local_43c);
    iVar1 = Abc_NtkIsStrash((Abc_Ntk_t *)pNode_local);
    if (iVar1 == 0) {
      Abc_NtkDupObj(pNtk_00,pAVar3,0);
      for (local_440 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_440 < iVar1;
          local_440 = local_440 + 1) {
        pAVar4 = Abc_ObjFanin(pAVar3,local_440);
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar4->field_6).pCopy);
      }
    }
    else {
      pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar4 = Abc_ObjChild0Copy(pAVar3);
      p1 = Abc_ObjChild1Copy(pAVar3);
      pAVar4 = Abc_AigAnd(pMan,pAVar4,p1);
      (pAVar3->field_6).pCopy = pAVar4;
    }
  }
  Abc_ObjAddFanin((Abc_Obj_t *)Buffer._992_8_,*(Abc_Obj_t **)(pNodeName_local + 0x40));
  Vec_PtrFree(p);
  iVar1 = Abc_NtkCheck(pNtk_00);
  if (iVar1 == 0) {
    fprintf(_stdout,"Abc_NtkCreateCone(): Network check has failed.\n");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateCone( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, char * pNodeName, int fUseAllCis )
{
    Abc_Ntk_t * pNtkNew; 
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pNodeCoNew;
    char Buffer[1000];
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsStrash(pNtk) );
    assert( Abc_ObjIsNode(pNode) || (Abc_NtkIsStrash(pNtk) && (Abc_AigNodeIsConst(pNode) || Abc_ObjIsCi(pNode)))  ); 
    
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // set the name
    sprintf( Buffer, "%s_%s", pNtk->pName, pNodeName );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // establish connection between the constant nodes
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, &pNode, 1 );
    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( fUseAllCis || Abc_NodeIsTravIdCurrent(pObj) ) // TravId is set by DFS
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }
    // add the PO corresponding to this output
    pNodeCoNew = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAssignName( pNodeCoNew, pNodeName, NULL );
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        // if it is an AIG, add to the hash table
        if ( Abc_NtkIsStrash(pNtk) )
        {
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
        }
        else
        {
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
    }
    // connect the internal nodes to the new CO
    Abc_ObjAddFanin( pNodeCoNew, pNode->pCopy );
    Vec_PtrFree( vNodes );

    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    return pNtkNew;
}